

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

int __thiscall diy::FileStorage::make_file_record(FileStorage *this,string *filename,size_t sz)

{
  ulong uVar1;
  unsigned_long uVar2;
  int *piVar3;
  unsigned_long *puVar4;
  int __type;
  int __type_00;
  _Base_ptr in_RDX;
  string *in_RSI;
  long in_RDI;
  accessor max;
  accessor cur;
  FileRecord fr;
  int res;
  FileRecord *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar5;
  key_type *in_stack_ffffffffffffff08;
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  *in_stack_ffffffffffffff10;
  resource_accessor<unsigned_long,_tthread::fast_mutex> local_b8;
  resource_accessor<unsigned_long,_tthread::fast_mutex> local_a0;
  undefined1 local_88 [80];
  resource_accessor<int,_tthread::fast_mutex> local_38;
  int local_1c;
  _Base_ptr local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  critical_resource<int,_tthread::fast_mutex>::access
            ((critical_resource<int,_tthread::fast_mutex> *)&local_38,(char *)(in_RDI + 0x58),
             (int)in_RDX);
  piVar3 = resource_accessor<int,_tthread::fast_mutex>::operator*(&local_38);
  iVar5 = *piVar3;
  *piVar3 = iVar5 + 1;
  resource_accessor<int,_tthread::fast_mutex>::~resource_accessor
            ((resource_accessor<int,_tthread::fast_mutex> *)0x11d35f);
  local_88._24_8_ = local_18;
  local_1c = iVar5;
  std::__cxx11::string::string((string *)(local_88 + 0x20),local_10);
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
            *)local_88,(char *)(in_RDI + 0x20),__type);
  resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::operator*((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
               *)local_88);
  std::
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  ::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  FileRecord::operator=
            ((FileRecord *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::~resource_accessor
            ((resource_accessor<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
              *)0x11d3f5);
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)&local_a0,
             (char *)(in_RDI + 0x60),__type_00);
  puVar4 = resource_accessor<unsigned_long,_tthread::fast_mutex>::operator*(&local_a0);
  *puVar4 = (long)&local_18->_M_color + *puVar4;
  critical_resource<unsigned_long,_tthread::fast_mutex>::access
            ((critical_resource<unsigned_long,_tthread::fast_mutex> *)&local_b8,
             (char *)(in_RDI + 0x70),(int)local_18);
  puVar4 = resource_accessor<unsigned_long,_tthread::fast_mutex>::operator*(&local_a0);
  uVar1 = *puVar4;
  puVar4 = resource_accessor<unsigned_long,_tthread::fast_mutex>::operator*(&local_b8);
  if (*puVar4 < uVar1) {
    puVar4 = resource_accessor<unsigned_long,_tthread::fast_mutex>::operator*(&local_a0);
    uVar2 = *puVar4;
    puVar4 = resource_accessor<unsigned_long,_tthread::fast_mutex>::operator*(&local_b8);
    *puVar4 = uVar2;
  }
  iVar5 = local_1c;
  resource_accessor<unsigned_long,_tthread::fast_mutex>::~resource_accessor
            ((resource_accessor<unsigned_long,_tthread::fast_mutex> *)0x11d59e);
  resource_accessor<unsigned_long,_tthread::fast_mutex>::~resource_accessor
            ((resource_accessor<unsigned_long,_tthread::fast_mutex> *)0x11d5ab);
  FileRecord::~FileRecord((FileRecord *)0x11d5b8);
  return iVar5;
}

Assistant:

int           make_file_record(const std::string& filename, size_t sz)
      {
        int res = (*count_.access())++;
        FileRecord  fr = { sz, filename };
        (*filenames_.access())[res] = fr;

        // keep track of sizes
        critical_resource<size_t>::accessor     cur = current_size_.access();
        *cur += sz;
        critical_resource<size_t>::accessor     max = max_size_.access();
        if (*cur > *max)
            *max = *cur;

        return res;
      }